

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::GatherBase::Run(GatherBase *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  long lVar6;
  bool *compile_error;
  GLenum drawBuffer;
  GLfloat colorf [4];
  Vec4 buffData;
  long *local_a0 [2];
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  GLenum local_5c;
  GLfloat local_58 [6];
  undefined1 local_40 [16];
  undefined4 extraout_var_00;
  
  iVar4 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x24])();
  if ((char)iVar4 == '\0') {
    lVar6 = 0;
  }
  else {
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1e])(this);
    this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->fbo);
    glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&this->rbo);
    glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,this->rbo);
    glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x8058,1,1);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->fbo);
    glu::CallLogWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,this->rbo);
    local_5c = 0x8ce0;
    glu::CallLogWrapper::glDrawBuffers(this_00,1,&local_5c);
    local_58[0] = 0.0;
    local_58[1] = 0.0;
    local_58[2] = 0.0;
    local_58[3] = 0.0;
    glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,local_58);
    glu::CallLogWrapper::glViewport(this_00,0,0,1,1);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->vbo);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(local_40,this);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x10,local_40,0x88e4);
    bVar3 = true;
    do {
      bVar1 = bVar3;
      if (bVar1) {
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1b])
                  (local_a0,this);
        plVar2 = local_a0[0];
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x14])
                  (local_80,this);
        GVar5 = TGBase::CreateProgram(&this->super_TGBase,(char *)plVar2,(char *)local_80[0]);
      }
      else {
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
                  (local_a0,this);
        plVar2 = local_a0[0];
        (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1c])
                  (local_80,this);
        GVar5 = TGBase::CreateProgram(&this->super_TGBase,(char *)plVar2,(char *)local_80[0]);
      }
      this->program = GVar5;
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0],local_90[0] + 1);
      }
      glu::CallLogWrapper::glBindAttribLocation(this_00,this->program,0,"v_in_0");
      glu::CallLogWrapper::glLinkProgram(this_00,this->program);
      bVar3 = TGBase::CheckProgram(&this->super_TGBase,this->program,compile_error);
      if (!bVar3) {
        return -1;
      }
      glu::CallLogWrapper::glUseProgram(this_00,this->program);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
      glu::CallLogWrapper::glDeleteProgram(this_00,this->program);
      iVar4 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1f])(this);
      if (CONCAT44(extraout_var,iVar4) == -1) {
        return -1;
      }
      bVar3 = false;
    } while (bVar1);
    iVar4 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x25])(this);
    lVar6 = CONCAT44(extraout_var_00,iVar4);
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		if (!Supported())
			return NO_ERROR;
		Init();

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);
		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, 1, 1);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		GLenum drawBuffer = GL_COLOR_ATTACHMENT0;
		glDrawBuffers(1, &drawBuffer);
		GLfloat colorf[4] = { 0, 0, 0, 0 };
		glClearBufferfv(GL_COLOR, 0, colorf);
		glViewport(0, 0, 1, 1);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		glVertexAttribPointer(0, 4, GL_FLOAT, false, 0, 0);
		glEnableVertexAttribArray(0);
		Vec4 buffData = BufferData();
		glBufferData(GL_ARRAY_BUFFER, 16, &buffData, GL_STATIC_DRAW);

		for (int i = 0; i < 2; ++i)
		{
			if (i == 0)
				program = CreateProgram(VertexShader().c_str(), FallthroughFragmentShader().c_str());
			else
				program = CreateProgram(FallthroughVertexShader().c_str(), FragmentShader().c_str());
			glBindAttribLocation(program, 0, "v_in_0");
			glLinkProgram(program);
			if (!CheckProgram(program))
				return ERROR;
			glUseProgram(program);

			glDrawArrays(GL_POINTS, 0, 1);
			glReadBuffer(GL_COLOR_ATTACHMENT0);

			glDeleteProgram(program);

			if (Verify() == ERROR)
				return ERROR;
		}

		return TestCompute();
	}